

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

IRet * __thiscall
vkt::shaderexecutor::Functions::OuterProduct<4,_2>::doApply
          (IRet *__return_storage_ptr__,OuterProduct<4,_2> *this,EvalContext *ctx,IArgs *iargs)

{
  IArgs *ctx_00;
  Interval *pIVar1;
  Interval *arg1;
  Vector<tcu::Interval,_4> *this_00;
  Void local_65 [20];
  Void local_51;
  IRet local_50;
  int local_34;
  int local_30;
  int col;
  int row;
  IArgs *iargs_local;
  EvalContext *ctx_local;
  OuterProduct<4,_2> *this_local;
  IRet *ret;
  
  col._3_1_ = 0;
  _row = iargs;
  iargs_local = (IArgs *)ctx;
  ctx_local = (EvalContext *)this;
  this_local = (OuterProduct<4,_2> *)__return_storage_ptr__;
  tcu::Matrix<tcu::Interval,_4,_2>::Matrix(__return_storage_ptr__);
  for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
    for (local_34 = 0; ctx_00 = iargs_local, local_34 < 2; local_34 = local_34 + 1) {
      pIVar1 = tcu::Vector<tcu::Interval,_4>::operator[](_row->a,local_30);
      arg1 = tcu::Vector<tcu::Interval,_2>::operator[](_row->b,local_34);
      Void::Void(&local_51);
      Void::Void(local_65);
      call<vkt::shaderexecutor::Functions::Mul>
                (&local_50,(EvalContext *)ctx_00,pIVar1,arg1,&local_51,local_65);
      this_00 = tcu::Matrix<tcu::Interval,_4,_2>::operator[](__return_storage_ptr__,local_34);
      pIVar1 = tcu::Vector<tcu::Interval,_4>::operator[](this_00,local_30);
      pIVar1->m_hasNaN = local_50.m_hasNaN;
      *(undefined7 *)&pIVar1->field_0x1 = local_50._1_7_;
      pIVar1->m_lo = local_50.m_lo;
      pIVar1->m_hi = local_50.m_hi;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply	(const EvalContext& ctx, const IArgs& iargs) const
	{
		IRet	ret;

		for (int row = 0; row < Rows; ++row)
		{
			for (int col = 0; col < Cols; ++col)
				ret[col][row] = call<Mul>(ctx, iargs.a[row], iargs.b[col]);
		}

		return ret;
	}